

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_dialer_free(void *arg)

{
  nni_list *list;
  void *item;
  
  ws_dialer_stop(arg);
  nni_strfree(*(char **)((long)arg + 0xb8));
  list = (nni_list *)((long)arg + 0xe8);
  item = nni_list_first(list);
  while (item != (void *)0x0) {
    nni_list_remove(list,item);
    nni_strfree(*(char **)((long)item + 0x10));
    nni_strfree(*(char **)((long)item + 0x18));
    nni_free(item,0x20);
    item = nni_list_first(list);
  }
  if (*(nni_http_client **)((long)arg + 0x50) != (nni_http_client *)0x0) {
    nni_http_client_fini(*(nni_http_client **)((long)arg + 0x50));
  }
  if (*(nng_url **)((long)arg + 0xc0) != (nng_url *)0x0) {
    nng_url_free(*(nng_url **)((long)arg + 0xc0));
  }
  nni_cv_fini((nni_cv *)((long)arg + 0x80));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x58));
  nni_free(arg,0x118);
  return;
}

Assistant:

static void
ws_dialer_free(void *arg)
{
	nni_ws_dialer *d = arg;
	ws_header     *hdr;

	ws_dialer_stop(d);

	nni_strfree(d->proto);
	while ((hdr = nni_list_first(&d->headers)) != NULL) {
		nni_list_remove(&d->headers, hdr);
		nni_strfree(hdr->name);
		nni_strfree(hdr->value);
		NNI_FREE_STRUCT(hdr);
	}
	if (d->client) {
		nni_http_client_fini(d->client);
	}
	if (d->url) {
		nng_url_free(d->url);
	}
	nni_cv_fini(&d->cv);
	nni_mtx_fini(&d->mtx);
	NNI_FREE_STRUCT(d);
}